

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall kratos::GeneratorGraphVisitor::~GeneratorGraphVisitor(GeneratorGraphVisitor *this)

{
  GeneratorGraphVisitor *this_local;
  
  ~GeneratorGraphVisitor(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

void visit(Generator *generator) override {
        auto *parent_node = g_->get_node(generator);
        for (auto const &child : generator->get_child_generators()) {
            auto *child_node = g_->get_node(child.get());
            if (child_node->parent != nullptr)
                throw InternalException(::format("{0} already has a parent",
                                                 child_node->parent->generator->instance_name));
            child_node->parent = parent_node;
            parent_node->children.emplace(child_node->generator);
        }
    }